

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O2

int run_test_async_ref(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  uv_async_t h;
  
  uVar2 = uv_default_loop();
  uv_async_init(uVar2,&h,0);
  uv_unref(&h);
  uVar2 = uv_default_loop();
  uv_run(uVar2,0);
  do_close(&h);
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 == 0) {
    return 0;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ref.c"
          ,0x7f,"0 == uv_loop_close(uv_default_loop())");
  abort();
}

Assistant:

TEST_IMPL(async_ref) {
  uv_async_t h;
  uv_async_init(uv_default_loop(), &h, NULL);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  do_close(&h);
  MAKE_VALGRIND_HAPPY();
  return 0;
}